

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

bool DirUtils::IsSameDir(string *p1,string *p2)

{
  _Alloc_hider _Var1;
  int iVar2;
  bool bVar3;
  string s2;
  string s1;
  string local_60;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  AbsPath(p1,&local_40);
  AbsPath(p2,&local_60);
  _Var1._M_p = local_60._M_dataplus._M_p;
  if (local_40._M_string_length == local_60._M_string_length) {
    if (local_40._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_40._M_dataplus._M_p,local_60._M_dataplus._M_p,local_40._M_string_length);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != &local_60.field_2) {
    operator_delete(_Var1._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool DirUtils::IsSameDir(const string& p1, const string& p2){
	string s1, s2;
	AbsPath(p1, s1);
	AbsPath(p2, s2);
	return s1 == s2;
}